

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O0

void resize(ATimeUs timestamp,uint old_w,uint old_h)

{
  AMat4f local_58;
  undefined4 local_18;
  uint local_14;
  float dpm;
  uint old_h_local;
  uint old_w_local;
  ATimeUs timestamp_local;
  
  g.target.viewport.y = 0;
  g.target.viewport.x = 0;
  g.target.viewport.w = a_app_state->width;
  g.target.viewport.h = a_app_state->height;
  g.target.framebuffer = (AGLFramebuffer *)0x0;
  local_18 = 0x47147000;
  local_14 = old_h;
  dpm = (float)old_w;
  old_h_local = timestamp;
  aMat4fPerspective(&local_58,0.1,100.0,(float)a_app_state->width / 38000.0,
                    (float)a_app_state->height / 38000.0);
  memcpy(&g.projection,&local_58,0x40);
  return;
}

Assistant:

static void resize(ATimeUs timestamp, unsigned int old_w, unsigned int old_h) {
	(void)(timestamp);
	(void)(old_w);
	(void)(old_h);
	g.target.viewport.x = g.target.viewport.y = 0;
	g.target.viewport.w = a_app_state->width;
	g.target.viewport.h = a_app_state->height;

	g.target.framebuffer = NULL;

	const float dpm = 38e3f; /* ~96 dpi */
	g.projection = aMat4fPerspective(.1f, 100.f, a_app_state->width / dpm, a_app_state->height / dpm);
}